

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O1

vector<CardStyle,_std::allocator<CardStyle>_> * __thiscall
BattleWithLandlord::GenStrategy
          (vector<CardStyle,_std::allocator<CardStyle>_> *__return_storage_ptr__,
          BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *style,
          CardStyle *last)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  undefined1 uVar4;
  Type TVar5;
  _Rb_tree_color _Var6;
  CardStyle *pCVar7;
  bool bVar8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  undefined1 *puVar14;
  _Rb_tree_node_base *p_Var15;
  multiset<char,_std::less<char>,_std::allocator<char>_> *pmVar16;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  ulong uVar19;
  uint uVar20;
  iterator it;
  _Rb_tree_header *p_Var21;
  undefined1 auVar22 [8];
  vector<CardStyle,std::allocator<CardStyle>> *pvVar23;
  int iVar24;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range10;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range7;
  char x;
  int carry;
  char x_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_1;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count_;
  Type local_1cc;
  vector<CardStyle,std::allocator<CardStyle>> *local_1c8;
  _Rb_tree_node_base *local_1c0;
  Type local_1b4;
  CardStyle *local_1b0;
  multiset<char,_std::less<char>,_std::allocator<char>_> *local_1a8;
  _Rb_tree_node_base *local_1a0;
  Type local_194;
  undefined1 local_190 [12];
  int local_184;
  _Base_ptr local_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  _Base_ptr local_168;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_150;
  ulong local_120;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  local_118;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_f8;
  undefined1 local_c8 [8];
  multiset<char,_std::less<char>,_std::allocator<char>_> *pmStack_c0;
  _Base_ptr local_b8;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_90;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = &local_f8._M_impl.super__Rb_tree_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (style->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var21 = &(style->_M_t)._M_impl.super__Rb_tree_header;
  p_Var12 = &p_Var3->_M_header;
  p_Var9 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_1c8 = (vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var11 != p_Var21) {
    do {
      p_Var2 = p_Var11 + 1;
      p_Var9 = &p_Var3->_M_header;
      if (local_f8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        uVar4 = (undefined1)p_Var2->_M_color;
        p_Var17 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((char)uVar4 <= (char)*(size_t *)(p_Var17 + 1)) {
            p_Var9 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)[(char)*(size_t *)(p_Var17 + 1) < (char)uVar4];
        } while (p_Var17 != (_Base_ptr)0x0);
      }
      p_Var18 = p_Var3;
      if (((_Rb_tree_header *)p_Var9 != p_Var3) &&
         (p_Var18 = (_Rb_tree_header *)p_Var9,
         (char)p_Var2->_M_color < (char)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
        p_Var18 = p_Var3;
      }
      if (p_Var18 == p_Var3) {
        pmVar10 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                  ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&local_f8,(key_type *)p_Var2);
        *pmVar10 = 1;
      }
      else {
        pmVar10 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                  ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&local_f8,(key_type *)p_Var2);
        *pmVar10 = *pmVar10 + 1;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      p_Var9 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while ((_Rb_tree_header *)p_Var11 != p_Var21);
  }
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(char)uVar4 < '\x11']) {
    uVar4 = (undefined1)p_Var9[1]._M_color;
    if ('\x10' < (char)uVar4) {
      p_Var12 = p_Var9;
    }
  }
  p_Var11 = &p_Var3->_M_header;
  p_Var9 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var3) &&
     (p_Var17 = p_Var12, '\x11' < (char)p_Var12[1]._M_color)) {
    p_Var17 = &p_Var3->_M_header;
  }
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(char)uVar4 < '\x12']) {
    uVar4 = (undefined1)p_Var9[1]._M_color;
    if ('\x11' < (char)uVar4) {
      p_Var11 = p_Var9;
    }
  }
  p_Var12 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var3) &&
     (p_Var12 = p_Var11, '\x12' < (char)p_Var11[1]._M_color)) {
    p_Var12 = &p_Var3->_M_header;
  }
  if (((_Rb_tree_header *)p_Var17 != p_Var3) && ((_Rb_tree_header *)p_Var12 != p_Var3)) {
    local_178 = (_Base_ptr)(local_190 + 8);
    local_190._8_4_ = _S_red;
    local_180 = (_Base_ptr)0x0;
    local_168 = (_Base_ptr)0x0;
    local_150._M_impl._0_1_ =
         (_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>)0x11;
    local_170 = local_178;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    _M_insert_equal<char>
              ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *
               )local_190,(char *)&local_150);
    local_150._M_impl._0_1_ = 0x12;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    _M_insert_equal<char>
              ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *
               )local_190,(char *)&local_150);
    local_150._M_impl._0_4_ = 6;
    local_90._M_impl._0_4_ = 0x13;
    std::vector<CardStyle,std::allocator<CardStyle>>::
    emplace_back<CardStyle::Type,int,std::multiset<char,std::less<char>,std::allocator<char>>&>
              (local_1c8,(Type *)&local_150,(int *)&local_90,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
              local_190);
  }
  if (last->type == PASS) {
    if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      p_Var11 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_1c0 = p_Var11;
        if (0 < *(int *)&p_Var11[1].field_0x4) {
          p_Var2 = p_Var11 + 1;
          uVar19 = 1;
          do {
            local_190._8_4_ = _S_red;
            local_180 = (_Base_ptr)0x0;
            local_178 = (_Base_ptr)(local_190 + 8);
            local_168 = (_Base_ptr)0x0;
            local_170 = local_178;
            local_120 = uVar19;
            do {
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)local_190,(char *)p_Var2);
              uVar20 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar20;
            } while (uVar20 != 0);
            iVar24 = (int)local_120;
            if (iVar24 == 1) {
              if ((char)p_Var2->_M_color < '\x01') {
                local_150._M_impl._0_4_ = 7;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)&local_150,(char *)p_Var2,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
              }
              else {
                local_150._M_impl._0_4_ = 1;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)&local_150,(char *)p_Var2,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
              }
              local_150._M_impl._0_4_ = 1;
              puVar14 = (undefined1 *)std::_Rb_tree_increment(local_1c0);
              if ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header) {
                iVar24 = (int)(char)p_Var2->_M_color;
                p_Var15 = local_1c0;
                do {
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  iVar24 = iVar24 + 1;
                  if (iVar24 != (char)p_Var15[1]._M_color) break;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)(p_Var15 + 1));
                  iVar1 = local_150._M_impl._0_4_ + 1;
                  bVar8 = 3 < (int)local_150._M_impl._0_4_;
                  local_150._M_impl._0_4_ = iVar1;
                  if (bVar8) {
                    local_90._M_impl._0_4_ = 1;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                              (local_1c8,(Type *)&local_90,(char *)p_Var2,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190,
                               (int *)&local_150);
                  }
                  puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                } while ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header);
              }
            }
            else if (iVar24 == 2) {
              local_150._M_impl._0_4_ = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_150,(char *)p_Var2,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
              local_150._M_impl._0_4_ = 1;
              puVar14 = (undefined1 *)std::_Rb_tree_increment(local_1c0);
              if ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header) {
                iVar24 = (int)(char)p_Var2->_M_color;
                p_Var15 = local_1c0;
                do {
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  iVar24 = iVar24 + 1;
                  if ((iVar24 != (char)p_Var15[1]._M_color) || (*(int *)&p_Var15[1].field_0x4 < 2))
                  break;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)(p_Var15 + 1));
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)(p_Var15 + 1));
                  iVar1 = local_150._M_impl._0_4_ + 1;
                  bVar8 = 1 < (int)local_150._M_impl._0_4_;
                  local_150._M_impl._0_4_ = iVar1;
                  if (bVar8) {
                    local_90._M_impl._0_4_ = 2;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                              (local_1c8,(Type *)&local_90,(char *)p_Var2,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190,
                               (int *)&local_150);
                  }
                  puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                } while ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header);
              }
            }
            else if (iVar24 == 3) {
              local_150._M_impl._0_4_ = 3;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_150,(char *)p_Var2,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
              local_1cc = MONO;
              puVar14 = (undefined1 *)std::_Rb_tree_increment(local_1c0);
              if ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header) {
                iVar24 = (int)(char)p_Var2->_M_color;
                p_Var15 = local_1c0;
                do {
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  iVar24 = iVar24 + 1;
                  if ((iVar24 != (char)p_Var15[1]._M_color) || (*(int *)&p_Var15[1].field_0x4 < 3))
                  break;
                  p_Var13 = p_Var15 + 1;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)p_Var13);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)p_Var13);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_190,(char *)p_Var13);
                  local_1cc = local_1cc + MONO;
                  local_150._M_impl._0_4_ = 3;
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                            (local_1c8,(Type *)&local_150,(char *)p_Var2,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190,
                             (int *)&local_1cc);
                  puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                } while ((_Rb_tree_header *)puVar14 != &local_f8._M_impl.super__Rb_tree_header);
              }
              local_118.
              super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
              p_Var15 = (_Rb_tree_node_base *)0x0;
              do {
                local_1b4 = *(Type *)((long)&p_Var15->_M_color +
                                     (long)&local_118.
                                            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                     );
                local_1a0 = p_Var15;
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                       *)local_190);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_190,(char *)p_Var2);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_190,(char *)p_Var2);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_190,(char *)p_Var2);
                local_1cc = MONO;
                local_1b0 = (CardStyle *)CONCAT44(local_1b0._4_4_,(int)(char)p_Var2->_M_color);
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::_Rb_tree(&local_150,&local_f8);
                p_Var15 = local_1c0;
                do {
                  if ((_Rb_tree_header *)p_Var15 == &local_f8._M_impl.super__Rb_tree_header) break;
                  pmVar10 = std::
                            map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                          *)&local_150,(key_type *)(p_Var15 + 1));
                  *pmVar10 = 0;
                  local_c8 = (undefined1  [8])0x0;
                  pmStack_c0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)0x0;
                  local_b8 = (_Base_ptr)0x0;
                  bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                    *)&local_150,local_1cc,local_1b4,
                                   (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                    *)local_c8);
                  if ((bVar8) &&
                     (local_1a8 = pmStack_c0, auVar22 = local_c8,
                     local_c8 != (undefined1  [8])pmStack_c0)) {
                    do {
                      std::
                      _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                  *)&local_90,
                                 (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                  *)local_190);
                      for (p_Var13 = (((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header.
                                     _M_header._M_left;
                          (_Rb_tree_header *)p_Var13 !=
                          &(((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header;
                          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                        uVar20 = local_194 >> 8;
                        local_194 = CONCAT31((int3)uVar20,(char)p_Var13[1]._M_color);
                        std::
                        _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        ::_M_insert_equal<char_const&>
                                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                    *)&local_90,(char *)&local_194);
                      }
                      local_194 = TRIPLE;
                      std::vector<CardStyle,std::allocator<CardStyle>>::
                      emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int&>
                                (local_1c8,&local_194,(char *)p_Var2,
                                 (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_90
                                 ,(int *)&local_1cc,(int *)&local_1b4);
                      std::
                      _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                   *)&local_90);
                      auVar22 = (undefined1  [8])((long)auVar22 + 0x30);
                    } while (auVar22 != (undefined1  [8])local_1a8);
                  }
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  if ((_Rb_tree_header *)p_Var15 == &local_f8._M_impl.super__Rb_tree_header) {
LAB_00109e39:
                    bVar8 = false;
                  }
                  else {
                    iVar24 = (int)local_1b0 + 1;
                    local_1b0 = (CardStyle *)CONCAT44(local_1b0._4_4_,iVar24);
                    if ((iVar24 != (char)p_Var15[1]._M_color) || (*(int *)&p_Var15[1].field_0x4 < 3)
                       ) goto LAB_00109e39;
                    p_Var13 = p_Var15 + 1;
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_190,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_190,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_190,(char *)p_Var13);
                    local_1cc = local_1cc + MONO;
                    bVar8 = true;
                  }
                  std::
                  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                             *)local_c8);
                } while (bVar8);
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::~_Rb_tree(&local_150);
                p_Var15 = (_Rb_tree_node_base *)&local_1a0->field_0x4;
              } while (p_Var15 != (_Rb_tree_node_base *)0x8);
            }
            else {
              local_150._M_impl._0_4_ = 5;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_150,(char *)p_Var2,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_190);
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::_Rb_tree(&local_150,&local_f8);
              pmVar10 = std::
                        map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                      *)&local_150,(key_type *)p_Var2);
              *pmVar10 = *pmVar10 + -4;
              local_118.
              super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
              pmVar16 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)0x0;
              do {
                local_1cc = *(Type *)((long)&(pmVar16->_M_t)._M_impl.field_0x0 +
                                     (long)&local_118.
                                            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data);
                local_c8 = (undefined1  [8])0x0;
                pmStack_c0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)0x0;
                local_b8 = (_Base_ptr)0x0;
                local_1a8 = pmVar16;
                bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                  *)&local_150,2,local_1cc,
                                 (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                  *)local_c8);
                pmVar16 = pmStack_c0;
                auVar22 = local_c8;
                if (bVar8) {
                  for (; auVar22 != (undefined1  [8])pmVar16;
                      auVar22 = (undefined1  [8])((long)auVar22 + 0x30)) {
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)&local_90,
                               (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)local_190);
                    for (p_Var15 = (((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header.
                                   _M_header._M_left;
                        (_Rb_tree_header *)p_Var15 !=
                        &(((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header;
                        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                      uVar20 = local_1b4 >> 8;
                      local_1b4 = CONCAT31((int3)uVar20,(char)p_Var15[1]._M_color);
                      std::
                      _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      ::_M_insert_equal<char_const&>
                                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                  *)&local_90,(char *)&local_1b4);
                    }
                    local_1b4 = QUARD;
                    local_194 = PAIR;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int&>
                              (local_1c8,&local_1b4,(char *)p_Var2,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_90,
                               (int *)&local_194,(int *)&local_1cc);
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                 *)&local_90);
                  }
                }
                std::
                vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                           *)local_c8);
                pmVar16 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          &(local_1a8->_M_t)._M_impl.field_0x4;
              } while (pmVar16 != (multiset<char,_std::less<char>,_std::allocator<char>_> *)0x8);
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::~_Rb_tree(&local_150);
            }
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                         *)local_190);
            uVar20 = (uint)local_120;
          } while ((uVar20 < 4) &&
                  (uVar19 = (ulong)(uVar20 + 1), (int)uVar20 < *(int *)&local_1c0[1].field_0x4));
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_1c0);
      } while ((_Rb_tree_header *)p_Var11 != &local_f8._M_impl.super__Rb_tree_header);
    }
    pvVar23 = local_1c8;
    std::
    sort<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>
              (*(undefined8 *)local_1c8,*(undefined8 *)(local_1c8 + 8));
  }
  else {
    if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      local_1a8 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)&last->carry;
      p_Var11 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1b0 = last;
      do {
        local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_150._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_150._M_impl.super__Rb_tree_header._M_header;
        local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var2 = p_Var11 + 1;
        local_1c0 = p_Var11;
        local_150._M_impl.super__Rb_tree_header._M_header._M_right =
             local_150._M_impl.super__Rb_tree_header._M_header._M_left;
        if (*(int *)&p_Var11[1].field_0x4 == 4) {
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&local_150,(char *)p_Var2);
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&local_150,(char *)p_Var2);
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&local_150,(char *)p_Var2);
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&local_150,(char *)p_Var2);
          _Var6 = p_Var2->_M_color;
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          _Rb_tree(&local_60,
                   (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    *)&local_150);
          CardStyle::CardStyle
                    ((CardStyle *)local_190,QUARD_BOMB,(int)(char)_Var6,
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_60,1,0);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree(&local_60);
          TVar5 = last->type;
          if (local_190._0_4_ == PASS || TVar5 != PASS) {
            if (((TVar5 == local_190._0_4_) && (last->len == local_190._8_4_)) &&
               (last->carry == local_184)) {
              bVar8 = last->id < (int)local_190._4_4_;
            }
            else {
              if (local_190._0_4_ == JOKER_BOMB) goto LAB_001093d0;
              bVar8 = local_190._0_4_ == QUARD_BOMB && TVar5 != JOKER_BOMB;
            }
            if (bVar8) goto LAB_001093d0;
          }
          else {
LAB_001093d0:
            std::vector<CardStyle,std::allocator<CardStyle>>::emplace_back<CardStyle&>
                      (local_1c8,(CardStyle *)local_190);
          }
          if (last->type != QUARD) {
LAB_00109534:
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)&local_150);
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                         *)&local_180);
            goto LAB_00109546;
          }
          if (last->id < (int)(char)p_Var2->_M_color) {
            std::
            _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::_Rb_tree(&local_90,&local_f8);
            pmVar10 = std::
                      map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                    *)&local_90,(key_type *)p_Var2);
            *pmVar10 = *pmVar10 + -4;
            local_118.
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_118.
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)&local_90,2,*(int *)&(local_1a8->_M_t)._M_impl,&local_118);
            if ((bVar8) &&
               (local_1a0 = (_Rb_tree_node_base *)
                            local_118.
                            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
               p_Var15 = (_Rb_tree_node_base *)
                         local_118.
                         super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_118.
               super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              do {
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                _Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                          *)local_c8,
                         (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                          *)&local_150);
                for (p_Var13 = p_Var15->_M_right;
                    p_Var13 != (_Rb_tree_node_base *)&p_Var15->_M_parent;
                    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                  local_1cc._1_3_ = (undefined3)(local_1cc >> 8);
                  local_1cc = CONCAT31(local_1cc._1_3_,(char)p_Var13[1]._M_color);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_c8,(char *)&local_1cc);
                }
                local_1cc = QUARD;
                local_1b4 = PAIR;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int_const&>
                          (local_1c8,&local_1cc,(char *)p_Var2,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_c8,
                           (int *)&local_1b4,(int *)local_1a8);
                last = local_1b0;
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                           *)local_c8);
                p_Var15 = (_Rb_tree_node_base *)&p_Var15[1]._M_left;
              } while (p_Var15 != local_1a0);
            }
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_118);
            std::
            _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::~_Rb_tree(&local_90);
            goto LAB_00109534;
          }
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)&local_180);
        }
        else {
LAB_00109546:
          TVar5 = last->type;
          if (TVar5 == TRIPLE) {
            if ((last->id < (int)(char)p_Var2->_M_color) && (2 < *(int *)&local_1c0[1].field_0x4)) {
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_150,(char *)p_Var2);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_150,(char *)p_Var2);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_150,(char *)p_Var2);
              if (*(int *)&(local_1a8->_M_t)._M_impl == 0) {
                if (last->len == 1) {
                  local_190._0_4_ = TRIPLE;
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                            (local_1c8,(Type *)local_190,(char *)p_Var2,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150);
                }
                else {
                  local_190._0_4_ = MONO;
                  iVar24 = (int)(char)p_Var2->_M_color;
                  p_Var15 = local_1c0;
                  do {
                    puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                    last = local_1b0;
                    if ((_Rb_tree_header *)puVar14 == &local_f8._M_impl.super__Rb_tree_header)
                    goto LAB_00109acf;
                    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                    iVar24 = iVar24 + 1;
                    last = local_1b0;
                    if ((iVar24 != (char)p_Var15[1]._M_color) || (*(int *)&p_Var15[1].field_0x4 < 3)
                       ) goto LAB_00109acf;
                    p_Var13 = p_Var15 + 1;
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&local_150,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&local_150,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&local_150,(char *)p_Var13);
                    local_190._0_4_ = local_190._0_4_ + MONO;
                  } while (local_190._0_4_ != local_1b0->len);
                  local_90._M_impl._0_4_ = 3;
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                            (local_1c8,(Type *)&local_90,(char *)p_Var2,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150,
                             (int *)local_190);
                  last = local_1b0;
                }
              }
              else {
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                       *)&local_150);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&local_150,(char *)p_Var2);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&local_150,(char *)p_Var2);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&local_150,(char *)p_Var2);
                local_118.
                super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_118.
                                       super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
                local_120 = CONCAT44(local_120._4_4_,(int)(char)p_Var2->_M_color);
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            *)local_190,&local_f8);
                p_Var15 = local_1c0;
                do {
                  if ((_Rb_tree_header *)p_Var15 == &local_f8._M_impl.super__Rb_tree_header) break;
                  pmVar10 = std::
                            map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                          *)local_190,(key_type *)(p_Var15 + 1));
                  *pmVar10 = 0;
                  local_c8 = (undefined1  [8])0x0;
                  pmStack_c0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)0x0;
                  local_b8 = (_Base_ptr)0x0;
                  if (((uint)local_118.
                             super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == last->len) &&
                     (local_1a0 = p_Var15,
                     bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                       *)local_190,
                                      (uint)local_118.
                                            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                      *(int *)&(local_1a8->_M_t)._M_impl,
                                      (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                       *)local_c8), pmVar16 = pmStack_c0, p_Var15 = local_1a0,
                     pCVar7 = local_1b0, auVar22 = local_c8, bVar8)) {
                    for (; last = pCVar7, local_1b0 = last, local_1a0 = p_Var15,
                        auVar22 != (undefined1  [8])pmVar16;
                        auVar22 = (undefined1  [8])((long)auVar22 + 0x30)) {
                      std::
                      _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                  *)&local_90,
                                 (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                  *)&local_150);
                      for (p_Var15 = (((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header.
                                     _M_header._M_left;
                          (_Rb_tree_header *)p_Var15 !=
                          &(((pointer)auVar22)->_M_t)._M_impl.super__Rb_tree_header;
                          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                        local_1cc._1_3_ = (undefined3)(local_1cc >> 8);
                        local_1cc = CONCAT31(local_1cc._1_3_,(char)p_Var15[1]._M_color);
                        std::
                        _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        ::_M_insert_equal<char_const&>
                                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                    *)&local_90,(char *)&local_1cc);
                      }
                      local_1cc = TRIPLE;
                      std::vector<CardStyle,std::allocator<CardStyle>>::
                      emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int_const&>
                                (local_1c8,&local_1cc,(char *)p_Var2,
                                 (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_90
                                 ,(int *)&local_118,(int *)local_1a8);
                      std::
                      _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                   *)&local_90);
                      pCVar7 = local_1b0;
                      p_Var15 = local_1a0;
                    }
                    bVar8 = false;
                  }
                  else {
                    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                    if ((_Rb_tree_header *)p_Var15 != &local_f8._M_impl.super__Rb_tree_header) {
                      iVar24 = (int)local_120 + 1;
                      local_120 = CONCAT44(local_120._4_4_,iVar24);
                      if ((iVar24 == (char)p_Var15[1]._M_color) &&
                         (2 < *(int *)&p_Var15[1].field_0x4)) {
                        p_Var13 = p_Var15 + 1;
                        std::
                        _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        ::_M_insert_equal<char_const&>
                                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                    *)&local_150,(char *)p_Var13);
                        std::
                        _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        ::_M_insert_equal<char_const&>
                                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                    *)&local_150,(char *)p_Var13);
                        std::
                        _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        ::_M_insert_equal<char_const&>
                                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                    *)&local_150,(char *)p_Var13);
                        local_118.
                        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)CONCAT44(local_118.
                                               super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (uint)local_118.
                                                                                                          
                                                  super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                        bVar8 = true;
                        goto LAB_00109827;
                      }
                    }
                    bVar8 = false;
                  }
LAB_00109827:
                  std::
                  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                             *)local_c8);
                } while (bVar8);
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                             *)local_190);
              }
            }
          }
          else if (TVar5 == PAIR) {
            if ((last->id < (int)(char)p_Var2->_M_color) && (1 < *(int *)&local_1c0[1].field_0x4)) {
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_150,(char *)p_Var2);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_150,(char *)p_Var2);
              if (last->len == 1) {
                local_190._0_4_ = PAIR;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)local_190,(char *)p_Var2,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150);
              }
              else {
                local_190._0_4_ = MONO;
                iVar24 = (int)(char)p_Var2->_M_color;
                p_Var15 = local_1c0;
                do {
                  puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                  last = local_1b0;
                  if ((_Rb_tree_header *)puVar14 == &local_f8._M_impl.super__Rb_tree_header)
                  goto LAB_00109acf;
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  iVar24 = iVar24 + 1;
                  last = local_1b0;
                  if ((iVar24 != (char)p_Var15[1]._M_color) || (*(int *)&p_Var15[1].field_0x4 < 2))
                  goto LAB_00109acf;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&local_150,(char *)(p_Var15 + 1));
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&local_150,(char *)(p_Var15 + 1));
                  TVar5 = local_190._0_4_ + MONO;
                  bVar8 = (int)local_190._0_4_ < 2;
                  local_190._0_4_ = TVar5;
                } while ((bVar8) || (TVar5 != local_1b0->len));
                local_90._M_impl._0_4_ = 2;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                          (local_1c8,(Type *)&local_90,(char *)p_Var2,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150,
                           (int *)local_190);
                last = local_1b0;
              }
            }
          }
          else if ((TVar5 == MONO) && (last->id < (int)(char)p_Var2->_M_color)) {
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&local_150,(char *)p_Var2);
            if (last->len == 1) {
              local_190._0_4_ = MONO;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)local_190,(char *)p_Var2,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150);
            }
            else {
              local_190._0_4_ = MONO;
              iVar24 = (int)(char)p_Var2->_M_color;
              p_Var15 = local_1c0;
              do {
                puVar14 = (undefined1 *)std::_Rb_tree_increment(p_Var15);
                last = local_1b0;
                if ((_Rb_tree_header *)puVar14 == &local_f8._M_impl.super__Rb_tree_header)
                goto LAB_00109acf;
                p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                iVar24 = iVar24 + 1;
                last = local_1b0;
                if (iVar24 != (char)p_Var15[1]._M_color) goto LAB_00109acf;
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&local_150,(char *)(p_Var15 + 1));
                TVar5 = local_190._0_4_ + MONO;
                bVar8 = (int)local_190._0_4_ < 4;
                local_190._0_4_ = TVar5;
              } while ((bVar8) || (TVar5 != local_1b0->len));
              local_90._M_impl._0_4_ = 1;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        (local_1c8,(Type *)&local_90,(char *)p_Var2,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_150,
                         (int *)local_190);
              last = local_1b0;
            }
          }
        }
LAB_00109acf:
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   *)&local_150);
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_1c0);
      } while ((_Rb_tree_header *)p_Var11 != &local_f8._M_impl.super__Rb_tree_header);
    }
    pvVar23 = local_1c8;
    std::vector<CardStyle,_std::allocator<CardStyle>_>::emplace_back<>
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)local_1c8);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_f8);
  return (vector<CardStyle,_std::allocator<CardStyle>_> *)pvVar23;
}

Assistant:

vector<CardStyle> BattleWithLandlord::GenStrategy(const multiset<byte> &style, const CardStyle &last) const {
    vector <CardStyle> all;
    map<byte, int> count;
    for (auto c = style.begin(); c != style.end(); ++c) {
        if (count.find(*c) != count.end()) {
            ++count[*c];
        } else {
            count[*c] = 1;
        }
    }
    auto vice_joker = count.find(17);
    auto joker = count.find(18);
    if (vice_joker != count.end() && joker != count.end()){
        multiset<byte> ms;
        ms.insert(17);
        ms.insert(18);
        all.emplace_back(CardStyle::JOKER_BOMB, 19, ms);
    }
    if (last.type == CardStyle::PASS) {
        for (auto c = count.begin(); c != count.end(); ++c) {
            for (int k = 1; k <= c->second && k <= 4; ++k) {
                multiset<byte> ms;
                for (int i = 0; i < k; ++i) {
                    ms.insert(c->first);
                }
                if (k == 1) {
                    if (c->first > 0)
                        all.emplace_back(CardStyle::MONO, c->first, ms);
                    else
                        all.emplace_back(CardStyle::EXT, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            all.emplace_back(CardStyle::MONO, c->first, ms, len);
                        }
                    }
                } else if (k == 2) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                        }
                    }
                } else if (k == 3) {
                    all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    int len = 1;
                    int prev = c->first;

                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                    }
                    
                    for (int carry : {1, 2}) {
                        ms.clear();
                        ms.insert(c->first);
                        ms.insert(c->first);
                        ms.insert(c->first);
                        len = 1;
                        prev = c->first;
                        auto count_ = count;
                        for (auto it = c; it != count.end();) {
                            count_[it->first] = 0; // in case of 333 + 3

                            vector<multiset<byte> > comb_res;
                            if (GenCarry(count_, len, carry, comb_res)) {
                                for (auto &cs: comb_res) {
                                    multiset<byte> _union = ms;
                                    for (auto x: cs) {
                                        _union.insert(x);
                                    }
                                    all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, carry);
                                }
                            }
                            if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                        }
                    }
                } else {
                    all.emplace_back(CardStyle::QUARD_BOMB, c->first, ms);
                    auto count_ = count;
                    count_[c->first] -= 4;
                    for (auto carry: {1, 2}) {
                        vector<multiset<byte> > comb_res;
                        if (GenCarry(count_, 2, carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::QUARD, c->first, _union, 2, carry);
                            }
                        }
                    }
                }
            }
        }
        sort(all.begin(), all.end(),
             [](const CardStyle &a, const CardStyle &b) {
             return a.pattern.size() > b.pattern.size();
        });
    } else {
        for (auto c = count.begin(); c != count.end(); ++c) {
            multiset<byte> ms;
            if (c->second == 4) {
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                auto style = CardStyle(CardStyle::QUARD_BOMB, c->first, ms);
                if (last < style) {
                    all.emplace_back(style);
                }
                if (last.type == CardStyle::QUARD) {
                    if (c->first <= last.id) continue;
                    auto count_ = count;
                    count_[c->first] -= 4;
                    vector<multiset<byte> > comb_res;
                    if (GenCarry(count_, 2, last.carry, comb_res)) {
                        for (auto &cs: comb_res) {
                            multiset<byte> _union = ms;
                            for (auto x: cs) {
                                _union.insert(x);
                            }
                            all.emplace_back(CardStyle::QUARD, c->first, _union, 2, last.carry);
                        }
                    }
                }
                ms.clear();
            }
            if (last.type == CardStyle::MONO) {
                if (c->first <= last.id) continue;
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::MONO, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::MONO, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::PAIR) {
                if (c->first <= last.id || c->second < 2) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::TRIPLE) {
                if (c->first <= last.id || c->second < 3) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.carry == 0) {
                    if (last.len == 1) {
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    } else {
                        int len = 1;
                        int prev = c->first;
                        for (auto it = c; next(it) != count.end();) {
                            if ((++it)->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                            if (len == last.len) {
                                all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                                break;
                            }
                        }
                    }
                } else {
                    ms.clear();
                    ms.insert(c->first);
                    ms.insert(c->first);
                    ms.insert(c->first);
                    int len = 1;
                    int prev = c->first;
                    auto count_ = count;
                    for (auto it = c; it != count.end();) {
                        count_[it->first] = 0;

                        vector<multiset<byte> > comb_res;
                        if (len == last.len && GenCarry(count_, len, last.carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, last.carry);
                            }
                            break;
                        }

                        if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                    }
                }
            }
        }
        all.emplace_back(); // PASS
    }
    return all;
}